

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<QString>::move(QList<QString> *this,qsizetype from,qsizetype to)

{
  QString *pQVar1;
  long lVar2;
  long lVar3;
  QString *pQVar4;
  
  if (from == to) {
    return;
  }
  detach(this);
  pQVar1 = (this->d).ptr;
  if (from < to) {
    lVar2 = from * 0x18;
    pQVar4 = pQVar1 + from + 1;
    lVar3 = to * 0x18;
  }
  else {
    lVar2 = to * 0x18;
    lVar3 = from * 0x18;
    pQVar4 = pQVar1 + from;
  }
  std::_V2::__rotate<QString*>((long)&(pQVar1->d).d + lVar2,pQVar4,(long)&pQVar1[1].d.d + lVar3);
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }